

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O2

void __thiscall
cnn::Node::backward(Node *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
                   ,Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  int iVar1;
  uint uVar2;
  pointer ppTVar3;
  pointer ppTVar4;
  size_t i_1;
  ulong uVar5;
  long lVar6;
  uint b;
  size_t i_2;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> xs_elems;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> xs_ptrs;
  Tensor fx_elem;
  Tensor dEdxi_elem;
  Tensor dEdf_elem;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_148;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  Tensor local_108;
  Tensor local_c0;
  Tensor local_78;
  
  iVar1 = (*this->_vptr_Node[7])();
  if (((char)iVar1 == '\0') && (uVar2 = (fx->d).bd, uVar2 != 1)) {
    for (b = 0; b < uVar2; b = b + 1) {
      local_148.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_118 = 0;
      uVar5 = 0;
      local_148.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_148.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_128 = 0;
      uStack_120 = 0;
      while( true ) {
        ppTVar4 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        ppTVar3 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)ppTVar4 - (long)ppTVar3 >> 3) <= uVar5) break;
        Tensor::batch_elem(&local_108,ppTVar3[uVar5],b);
        std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::emplace_back<cnn::Tensor>
                  (&local_148,&local_108);
        std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_108.bs);
        uVar5 = uVar5 + 1;
      }
      lVar6 = 0;
      for (uVar5 = 0; uVar5 < (ulong)((long)ppTVar4 - (long)ppTVar3 >> 3); uVar5 = uVar5 + 1) {
        local_108.d.d._0_8_ =
             (long)((local_148.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl
                     .super__Vector_impl_data._M_start)->d).d + lVar6;
        std::vector<cnn::Tensor_const*,std::allocator<cnn::Tensor_const*>>::
        emplace_back<cnn::Tensor_const*>
                  ((vector<cnn::Tensor_const*,std::allocator<cnn::Tensor_const*>> *)&local_128,
                   (Tensor **)&local_108);
        ppTVar3 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        ppTVar4 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        lVar6 = lVar6 + 0x48;
      }
      Tensor::batch_elem(&local_108,fx,b);
      Tensor::batch_elem(&local_78,dEdf,b);
      Tensor::batch_elem(&local_c0,dEdxi,b);
      (*this->_vptr_Node[6])
                (this,(vector<cnn::Tensor_const*,std::allocator<cnn::Tensor_const*>> *)&local_128,
                 &local_108,&local_78,(ulong)i,&local_c0);
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_c0.bs);
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_78.bs);
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_108.bs);
      std::_Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::~_Vector_base
                ((_Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *)
                 &local_128);
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_148);
      uVar2 = (fx->d).bd;
    }
    return;
  }
  (*this->_vptr_Node[6])(this,xs,fx,dEdf,(ulong)i,dEdxi);
  return;
}

Assistant:

void Node::backward(const std::vector<const Tensor*>& xs,
                    const Tensor& fx,
                    const Tensor& dEdf,
                    unsigned i,
                    Tensor& dEdxi) const {
  if(this->supports_multibatch() || fx.d.batch_elems() == 1) {
    backward_impl(xs, fx, dEdf, i, dEdxi);
  } else {
    for(unsigned b = 0; b < fx.d.batch_elems(); ++b) {
      std::vector<Tensor>  xs_elems;
      std::vector<const Tensor*> xs_ptrs;
      for(size_t i = 0; i < xs.size(); ++i) xs_elems.push_back(xs[i]->batch_elem(b));
      for(size_t i = 0; i < xs.size(); ++i) xs_ptrs.push_back(&xs_elems[i]);
      Tensor fx_elem(fx.batch_elem(b));
      Tensor dEdf_elem(dEdf.batch_elem(b));
      Tensor dEdxi_elem(dEdxi.batch_elem(b));
      backward_impl(xs_ptrs, fx_elem, dEdf_elem, i, dEdxi_elem);
    }
  }
}